

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationZ.hpp
# Opt level: O1

RotationZ<std::complex<double>_> * __thiscall
qclab::qgates::RotationZ<std::complex<double>_>::operator*=
          (RotationZ<std::complex<double>_> *this,RotationZ<std::complex<double>_> *rhs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  
  iVar5 = (*(this->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
            super_QObject<std::complex<double>_>._vptr_QObject[3])();
  iVar6 = (*(rhs->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
            super_QObject<std::complex<double>_>._vptr_QObject[3])(rhs);
  if (iVar5 == iVar6) {
    dVar1 = (this->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.cos_;
    dVar2 = (this->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.sin_;
    dVar3 = (rhs->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.cos_;
    dVar4 = (rhs->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.sin_;
    (this->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.cos_ =
         dVar1 * dVar3 - dVar4 * dVar2;
    (this->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.sin_ =
         dVar2 * dVar3 + dVar1 * dVar4;
    return this;
  }
  __assert_fail("this->qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationZ.hpp"
                ,0xa3,
                "RotationZ<T> &qclab::qgates::RotationZ<std::complex<double>>::operator*=(const RotationZ<T> &) [T = std::complex<double>]"
               );
}

Assistant:

inline RotationZ< T >& operator*=( const RotationZ< T >& rhs ) {
          assert( this->qubit() == rhs.qubit() ) ;
          this->rotation_ *= rhs.rotation() ;
          return *this ;
        }